

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

ByteData256 *
cfd::CollectSighashByTx
          (Transaction *transaction,OutPoint *outpoint,UtxoData *utxo,SigHashType *sighash_type,
          Pubkey *pubkey,Script *redeem_script,WitnessVersion witness_version,ByteData *param_8,
          TaprootScriptTree *param_9)

{
  bool bVar1;
  uint32_t uVar2;
  long in_RCX;
  OutPoint *in_RDX;
  Transaction *in_RSI;
  ByteData256 *in_RDI;
  SigHashType *in_R8;
  Pubkey *in_R9;
  Script *in_stack_00000008;
  WitnessVersion in_stack_00000010;
  Script script_data;
  uint32_t index;
  ByteData256 *sighash;
  Script *in_stack_fffffffffffffec0;
  SigHashType local_104;
  ByteData local_f8;
  undefined1 local_d9;
  Script local_d8;
  Script local_a0;
  Txid local_58;
  uint32_t local_34;
  Pubkey *local_30;
  SigHashType *local_28;
  long local_20;
  OutPoint *local_18;
  Transaction *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  core::OutPoint::GetTxid(&local_58,in_RDX);
  uVar2 = core::OutPoint::GetVout(local_18);
  uVar2 = (*(in_RSI->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                    (in_RSI,&local_58,(ulong)uVar2);
  core::Txid::~Txid((Txid *)0x521c95);
  local_34 = uVar2;
  core::Script::Script(&local_a0,in_stack_00000008);
  bVar1 = core::Script::IsEmpty(&local_a0);
  if (bVar1) {
    core::ScriptUtil::CreateP2pkhLockingScript(&local_d8,local_30);
    core::Script::operator=(&local_a0,&local_d8);
    core::Script::~Script(in_stack_fffffffffffffec0);
  }
  uVar2 = local_34;
  local_d9 = 0;
  core::Script::GetData(&local_f8,&local_a0);
  core::SigHashType::SigHashType(&local_104,local_28);
  core::Transaction::GetSignatureHash
            (in_RDI,local_10,uVar2,&local_f8,&local_104,(Amount *)(local_20 + 600),in_stack_00000010
            );
  core::ByteData::~ByteData((ByteData *)0x521df6);
  local_d9 = 1;
  core::Script::~Script((Script *)local_10);
  return in_RDI;
}

Assistant:

static ByteData256 CollectSighashByTx(
    const Transaction* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script,
    WitnessVersion witness_version, const ByteData*,
    const TaprootScriptTree*) {
  uint32_t index =
      transaction->GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  Script script_data = redeem_script;
  if (script_data.IsEmpty()) {
    script_data = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  }
  auto sighash = transaction->GetSignatureHash(
      index, script_data.GetData(), sighash_type, utxo.amount,
      witness_version);
  return sighash;
}